

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::initiatorFixtureHeartBeatInterval_TestRequestNeededHelper::RunImpl
          (initiatorFixtureHeartBeatInterval_TestRequestNeededHelper *this)

{
  _func_int **pp_Var1;
  Message *pMVar2;
  TestResults *pTVar3;
  Session *pSVar4;
  TestResults **ppTVar5;
  TestDetails **ppTVar6;
  int local_448 [2];
  UtcTimeStamp time;
  Logon local_428;
  Message receivedLogon;
  Message sentLogon;
  int local_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&sentLogon,8,8,8,0xd,5,0x7df);
  *(ulong *)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
             super_DateTime.m_date = CONCAT44(uStack_16c,local_170);
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
  super_DateTime.m_time = CONCAT44(uStack_164,uStack_168);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&sentLogon,0x10,0x10,0x10,0xd,5,0x898);
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.super_DateTime
  .m_date = local_170;
  *(undefined4 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.
    super_DateTime.field_0xc = uStack_16c;
  *(undefined4 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.
    super_DateTime.m_time = uStack_168;
  *(undefined4 *)
   ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.
           super_DateTime.m_time + 4) = uStack_164;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
  m_date = 0;
  pp_Var1 = (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.super_Responder.
            _vptr_Responder;
  *(undefined8 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
    field_0xc = *(undefined8 *)
                 &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                  startTimeStamp.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.
           super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                startTimeStamp.super_DateTime.m_time + 4);
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_date = 0;
  *(undefined8 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
    field_0xc = *(undefined8 *)
                 &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                  endTimeStamp.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.
           super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.
                super_DateTime.m_time + 4);
  (*pp_Var1[8])(this,1,0,0x1f);
  FIX::UtcTimeStamp::UtcTimeStamp(&time);
  createLogon((Logon *)&receivedLogon,"TW","ISLD",1);
  FIX::Message::Message(&sentLogon,&receivedLogon);
  FIX::Message::~Message(&receivedLogon);
  FIX::Session::send((Message *)(this->super_initiatorFixture).super_sessionFixture.object);
  FIX::Session::next();
  FIX::Session::logon((this->super_initiatorFixture).super_sessionFixture.object);
  createLogon(&local_428,"ISLD","TW",1);
  FIX::Message::Message(&receivedLogon,(Message *)&local_428);
  FIX::Message::~Message((Message *)&local_428);
  pMVar2 = (Message *)(this->super_initiatorFixture).super_sessionFixture.object;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_428);
  FIX::Session::next(pMVar2,(UtcTimeStamp *)&receivedLogon,SUB81(&local_428,0));
  FIX::process_sleep(2.0);
  FIX::Session::next();
  ppTVar5 = UnitTest::CurrentTest::Results();
  pTVar3 = *ppTVar5;
  local_448[1] = 4;
  local_448[0] = FIX::SessionState::getNextSenderMsgSeqNum
                           ((SessionState *)
                            ((this->super_initiatorFixture).super_sessionFixture.object + 0x250));
  ppTVar6 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_428,*ppTVar6,0x78e);
  UnitTest::CheckEqual<int,int>(pTVar3,local_448 + 1,local_448,(TestDetails *)&local_428);
  pSVar4 = (this->super_initiatorFixture).super_sessionFixture.object;
  if ((pSVar4[0x261] != (Session)0x1) || (((byte)pSVar4[0x263] & 1) == 0)) {
    ppTVar5 = UnitTest::CurrentTest::Results();
    pTVar3 = *ppTVar5;
    ppTVar6 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails((TestDetails *)&local_428,*ppTVar6,0x78f);
    UnitTest::TestResults::OnTestFailure(pTVar3,(TestDetails *)&local_428,"object->isLoggedOn()");
  }
  FIX::Message::~Message(&receivedLogon);
  FIX::Message::~Message(&sentLogon);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, HeartBeatInterval_TestRequestNeeded) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );
  createSession(1, 0, 31);

  UtcTimeStamp time;

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->logon();

  FIX::Message receivedLogon = createLogon( "ISLD", "TW", 1 );
  object->next(receivedLogon, UtcTimeStamp());

  //Force Heartbeat Interval Flow
  process_sleep(2);

  object->next();
  CHECK_EQUAL(4, object->getExpectedSenderNum());
  CHECK(object->isLoggedOn());
}